

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

Filter * helics::make_filter(InterfaceVisibility locality,FilterTypes type,Federate *mFed,
                            string_view name)

{
  string_view inputType;
  string_view inputType_00;
  string_view filterName;
  string_view filterName_00;
  string_view outputType;
  string_view outputType_00;
  string_view inputType_01;
  string_view inputType_02;
  string_view filterName_01;
  string_view filterName_02;
  string_view outputType_01;
  string_view outputType_02;
  Filter *pFVar1;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 in_RCX;
  Federate *in_RDX;
  int in_ESI;
  int in_EDI;
  Core *in_R8;
  Filter *unaff_retaddr;
  Filter *dfilt;
  Filter *dfilt_1;
  char *in_stack_fffffffffffffe98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffea0;
  Filter *local_150;
  Federate *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  Federate *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_80 [2];
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50 [2];
  Filter *local_30;
  Federate *local_28;
  undefined8 local_18;
  undefined8 in_stack_fffffffffffffff8;
  FilterTypes type_00;
  
  type_00 = (FilterTypes)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  if (in_ESI == 5) {
    local_28 = in_RDX;
    local_18 = in_RCX;
    if (in_EDI == 1) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_50);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60);
      filterName._M_str = in_stack_fffffffffffffef0;
      filterName._M_len = in_stack_fffffffffffffee8;
      inputType._M_str = in_stack_fffffffffffffee0;
      inputType._M_len = (size_t)in_RDX;
      outputType._M_str = in_stack_ffffffffffffff08;
      outputType._M_len = (size_t)in_stack_ffffffffffffff00;
      local_30 = &Federate::registerGlobalCloningFilter
                            (in_stack_fffffffffffffed0,filterName,inputType,outputType)->
                  super_Filter;
    }
    else {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_80);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90);
      filterName_01._M_str = in_stack_ffffffffffffff50;
      filterName_01._M_len = in_stack_ffffffffffffff48;
      inputType_01._M_str = in_stack_ffffffffffffff40;
      inputType_01._M_len = in_stack_ffffffffffffff38;
      outputType_01._M_str = in_stack_ffffffffffffff68;
      outputType_01._M_len = in_stack_ffffffffffffff60;
      local_30 = &Federate::registerCloningFilter
                            (in_stack_ffffffffffffff30,filterName_01,inputType_01,outputType_01)->
                  super_Filter;
    }
    this = &Federate::getCorePointer(local_28)->
            super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::get(this);
    addOperations(unaff_retaddr,type_00,in_R8);
    pFVar1 = local_30;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    (*(((Filter *)&pFVar1->super_Interface)->super_Interface)._vptr_Interface[6])
              (pFVar1,in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,local_18,in_R8);
  }
  else {
    if (in_EDI == 1) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8);
      filterName_00._M_str = in_stack_fffffffffffffef0;
      filterName_00._M_len = in_stack_fffffffffffffee8;
      inputType_00._M_str = in_stack_fffffffffffffee0;
      inputType_00._M_len = in_stack_fffffffffffffed8;
      outputType_00._M_str = in_stack_ffffffffffffff08;
      outputType_00._M_len = (size_t)in_stack_ffffffffffffff00;
      local_150 = Federate::registerGlobalFilter
                            (in_stack_fffffffffffffed0,filterName_00,inputType_00,outputType_00);
    }
    else {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffef8);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffee8);
      filterName_02._M_str = in_stack_ffffffffffffff50;
      filterName_02._M_len = in_stack_ffffffffffffff48;
      inputType_02._M_str = in_stack_ffffffffffffff40;
      inputType_02._M_len = in_stack_ffffffffffffff38;
      outputType_02._M_str = in_stack_ffffffffffffff68;
      outputType_02._M_len = in_stack_ffffffffffffff60;
      local_150 = Federate::registerFilter
                            (in_stack_ffffffffffffff30,filterName_02,inputType_02,outputType_02);
    }
    addOperations(unaff_retaddr,type_00,in_R8);
    local_30 = local_150;
  }
  return local_30;
}

Assistant:

Filter& make_filter(InterfaceVisibility locality,
                    FilterTypes type,
                    Federate* mFed,
                    std::string_view name)
{
    if (type == FilterTypes::CLONE) {
        Filter& dfilt = (locality == InterfaceVisibility::GLOBAL) ?
            mFed->registerGlobalCloningFilter(name) :
            mFed->registerCloningFilter(name);
        addOperations(&dfilt, type, mFed->getCorePointer().get());
        dfilt.setString("delivery", name);
        return dfilt;
    }
    auto& dfilt = (locality == InterfaceVisibility::GLOBAL) ? mFed->registerGlobalFilter(name) :
                                                              mFed->registerFilter(name);
    addOperations(&dfilt, type, nullptr);
    return dfilt;
}